

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uchar *puVar7;
  size_t local_48;
  size_t len;
  uint local_38;
  uint local_34;
  
  puVar7 = *p;
  if (end == puVar7 || (long)end - (long)puVar7 < 0) {
    iVar2 = -0x2460;
  }
  else {
    if (*puVar7 == '\x17') {
      bVar1 = false;
      lVar6 = 2;
    }
    else {
      if (*puVar7 != '\x18') {
        return -0x2462;
      }
      lVar6 = 4;
      bVar1 = true;
    }
    *p = puVar7 + 1;
    iVar2 = mbedtls_asn1_get_len(p,end,&local_48);
    if (iVar2 == 0) {
      if (local_48 == lVar6 + 10U) {
        puVar7 = *p;
      }
      else {
        if (local_48 != lVar6 + 0xbU) {
          return -0x2400;
        }
        puVar7 = *p;
        if (puVar7[local_48 - 1] != 'Z') {
          return -0x2400;
        }
      }
      *p = puVar7 + local_48;
      local_38 = x509_parse2_int(puVar7);
      tm->year = local_38;
      iVar2 = -0x2400;
      if (-1 < (int)local_38) {
        if (bVar1) {
          puVar7 = puVar7 + 2;
          uVar3 = x509_parse2_int(puVar7);
          tm->year = uVar3;
          if ((int)uVar3 < 0) {
            return -0x2400;
          }
          iVar5 = local_38 * 100;
          local_38 = uVar3;
        }
        else {
          iVar5 = 0x76c;
          if (local_38 < 0x32) {
            iVar5 = 2000;
          }
        }
        local_34 = iVar5 + local_38;
        tm->year = local_34;
        uVar3 = x509_parse2_int(puVar7 + 2);
        tm->mon = uVar3;
        iVar5 = x509_parse2_int(puVar7 + 4);
        tm->day = iVar5;
        len._0_4_ = x509_parse2_int(puVar7 + 6);
        tm->hour = (uint)len;
        len._4_4_ = x509_parse2_int(puVar7 + 8);
        tm->min = len._4_4_;
        uVar4 = x509_parse2_int(puVar7 + 10);
        tm->sec = uVar4;
        if (uVar3 < 0xd) {
          if ((0x15aaU >> (uVar3 & 0x1f) & 1) == 0) {
            if ((0xa50U >> (uVar3 & 0x1f) & 1) == 0) {
              if (uVar3 != 2) {
                return -0x2400;
              }
              if ((local_38 & 3) == 0) {
                if (local_34 % 100 == 0) {
                  uVar3 = (local_34 % 400 == 0) + 0x1c;
                }
                else {
                  uVar3 = 0x1d;
                }
              }
              else {
                uVar3 = 0x1c;
              }
            }
            else {
              uVar3 = 0x1e;
            }
          }
          else {
            uVar3 = 0x1f;
          }
          if ((((iVar5 - 1U < uVar3) && (local_34 < 10000)) && ((uint)len < 0x18)) &&
             ((len._4_4_ < 0x3c && (iVar2 = -0x2400, uVar4 < 0x3c)))) {
            iVar2 = 0;
          }
        }
      }
    }
    else {
      iVar2 = iVar2 + -0x2400;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_get_time(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_time *tm)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len, year_len;
    unsigned char tag;

    if ((end - *p) < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    tag = **p;

    if (tag == MBEDTLS_ASN1_UTC_TIME) {
        year_len = 2;
    } else if (tag == MBEDTLS_ASN1_GENERALIZED_TIME) {
        year_len = 4;
    } else {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
    }

    (*p)++;
    ret = mbedtls_asn1_get_len(p, end, &len);

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE, ret);
    }

    /* len is 12 or 14 depending on year_len, plus optional trailing 'Z' */
    if (len != year_len + 10 &&
        !(len == year_len + 11 && (*p)[(len - 1)] == 'Z')) {
        return MBEDTLS_ERR_X509_INVALID_DATE;
    }

    (*p) += len;
    return x509_parse_time(*p - len, tm, year_len);
}